

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR DSK_deletefile(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  FileName *varray;
  char *pcVar4;
  int iVar5;
  int iVar6;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  DLword *pDVar11;
  char *pcVar12;
  char *__src;
  char *in_RSI;
  __jmp_buf_tag *p_Var13;
  char *pcVar14;
  long lVar15;
  char ver [16];
  char fbuf [4096];
  char file [4096];
  char vless [4096];
  char dir [4096];
  int local_404c;
  char local_4048 [16];
  char local_4038 [4096];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  long lVar7;
  
  p_Var13 = jmpbuf;
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar2 = args[1];
  pcVar14 = (char *)p_Var13;
  if ((uVar2 & 1) != 0) {
    in_RSI = (char *)(ulong)uVar2;
    pcVar14 = "Misaligned pointer in NativeAligned4FromLAddr 0x%x\n";
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  Lisp_errno = (int *)(Lisp_world + uVar2);
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    in_RSI = (char *)(ulong)uVar2;
    pcVar14 = "Misaligned pointer in NativeAligned4FromLAddr 0x%x\n";
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    local_404c = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2 + 5;
  }
  else {
    if ((char)Lisp_world[(ulong)uVar2 + 3] != 'C') {
      DSK_deletefile_cold_1();
      if ((int)(((__jmp_buf_tag *)((long)pcVar14 + 4000))->__saved_mask).__val[3] == -1) {
        return 0;
      }
      while( true ) {
        iVar5 = (int)(((__jmp_buf_tag *)((long)pcVar14 + 4000))->__saved_mask).__val[3];
        if (iVar5 == -1) {
          return 0;
        }
        pcVar10 = __src;
        pcVar12 = __src;
        if (iVar5 == 0) break;
        pcVar14 = (char *)((long)(((__jmp_buf_tag *)((long)pcVar14 + 4000))->__saved_mask).__val +
                          0x1c);
      }
      for (; (pcVar4 = pcVar12, *pcVar12 == '/' || (pcVar4 = pcVar10, *pcVar12 != '\0'));
          pcVar12 = pcVar12 + 1) {
        pcVar10 = pcVar4;
      }
      if (pcVar12 + -1 == pcVar10) {
        if (pcVar10 == __src) {
          in_RSI[0] = '/';
          in_RSI[1] = '\0';
        }
        else {
          strcpy(in_RSI,__src);
        }
      }
      else {
        strcpy(in_RSI,__src);
        sVar8 = strlen(in_RSI);
        (in_RSI + sVar8)[0] = '/';
        (in_RSI + sVar8)[1] = '\0';
      }
      strcat(in_RSI,pcVar14);
      return 1;
    }
    local_404c = *(int *)(Lisp_world + (ulong)uVar2 + 4) + 3;
  }
  if (0x1000 < local_404c) {
    *Lisp_errno = 200;
    return 0;
  }
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  iVar5 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
  iVar6 = 0x1000;
  if (iVar5 < 0x1000) {
    iVar6 = iVar5;
  }
  lVar7 = (long)iVar6;
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    if (iVar5 == 0) {
      pcVar14 = local_4038;
    }
    else {
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      pDVar11 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar2 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
      pcVar14 = local_4038;
      do {
        *pcVar14 = *(char *)((ulong)pDVar11 ^ 2);
        pcVar14 = pcVar14 + 1;
        pDVar11 = pDVar11 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    *pcVar14 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    if (iVar5 != 0) {
      uVar3 = *(uint *)(Lisp_world + uVar2);
      uVar1 = Lisp_world[(ulong)uVar2 + 2];
      lVar15 = 0;
      do {
        local_4038[lVar15] =
             *(char *)((long)Lisp_world + lVar15 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3
                      );
        lVar15 = lVar15 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar15);
    }
    local_4038[lVar7] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  unixpathname(local_4038,local_3038,1,0);
  iVar5 = unpack_filename(local_3038,local_1038,local_4038,local_4048,1);
  if (((iVar5 == 0) ||
      (iVar5 = get_version_array(local_1038,local_4038), varray = VA.files, iVar5 == 0)) ||
     ((VA.files)->version_no == 0xffffffff)) {
    return 0;
  }
  strcpy(local_3038,local_4038);
  if (local_4048[0] != '\0') {
    sVar8 = strlen(local_3038);
    (local_3038 + sVar8)[0] = '.';
    (local_3038 + sVar8)[1] = '~';
    local_3038[sVar8 + 2] = '\0';
    strcat(local_3038,local_4048);
    sVar8 = strlen(local_3038);
    (local_3038 + sVar8)[0] = '~';
    (local_3038 + sVar8)[1] = '\0';
  }
  iVar5 = get_oldest(local_1038,varray,local_3038,local_4038);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = get_versionless(VA.files,local_2038,local_1038);
  if (iVar5 == 0) {
    alarm(TIMEOUT_TIME);
    piVar9 = __errno_location();
    do {
      *piVar9 = 0;
      iVar5 = unlink(local_3038);
      if (iVar5 != -1) goto LAB_0011ddc0;
    } while (*piVar9 == 4);
  }
  else {
    iVar5 = check_vless_link(local_2038,VA.files,local_4038,&local_404c);
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = strcmp(local_3038,local_2038);
    if ((iVar5 == 0) || (iVar5 = strcmp(local_3038,local_4038), iVar5 == 0)) {
      alarm(TIMEOUT_TIME);
      piVar9 = __errno_location();
      if (local_4038[0] != '\0') {
        do {
          *piVar9 = 0;
          iVar5 = unlink(local_2038);
          if (iVar5 != -1) {
            local_404c = iVar5;
            alarm(0);
            alarm(TIMEOUT_TIME);
            do {
              *piVar9 = 0;
              iVar5 = unlink(local_4038);
              if (iVar5 != -1) {
                local_404c = iVar5;
                alarm(0);
                iVar5 = maintain_version(local_2038,0);
                if (iVar5 == 0) {
                  return 0;
                }
                return 0x4c;
              }
            } while (*piVar9 == 4);
            local_404c = iVar5;
            alarm(0);
            goto LAB_0011dd3a;
          }
        } while (*piVar9 == 4);
        local_404c = iVar5;
        alarm(0);
        goto LAB_0011dd3a;
      }
      do {
        *piVar9 = 0;
        iVar5 = unlink(local_2038);
        if (iVar5 != -1) goto LAB_0011ddc0;
      } while (*piVar9 == 4);
    }
    else {
      alarm(TIMEOUT_TIME);
      piVar9 = __errno_location();
      do {
        *piVar9 = 0;
        iVar5 = unlink(local_3038);
        if (iVar5 != -1) {
LAB_0011ddc0:
          local_404c = iVar5;
          alarm(0);
          return 0x4c;
        }
      } while (*piVar9 == 4);
    }
  }
  local_404c = -1;
  alarm(0);
LAB_0011dd3a:
  *Lisp_errno = *piVar9;
  return 0;
}

Assistant:

LispPTR DSK_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN], vless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive);
  unixpathname(fbuf, file, 1, 0, drive, &extlen, rawname);
#else
  unixpathname(fbuf, file, 1, 0);
#endif

  if (unpack_filename(file, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "oldest" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, file);
  if (get_oldest(dir, VA.files, file, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }

  /*
   * If a versionless file exists, we have to check the link status of it,
   * because deleting a versionless file or a file to which a versionless
   * file is linked will destroy the consistency of the version status.
   */

  if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

  if (strcmp(file, vless) == 0 || strcmp(file, fbuf) == 0) {
    if (*fbuf != '\0') {
      /*
       * Both of the versionless file and the file to which the
       * versionless file is linked have to be unlinked.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      /*
       * Finally, we have to maintain the version status.
       */
      if (maintain_version(vless, 0) == 0) return (NIL);
      return (ATOM_T);
    } else {
      /*
       * Although the versionfile is specified, it is not linked
       * to any file in VA.files.  We should not maintain the version
       * status after deleting the versionless file, because
       * we cannot say whether the versionless file is actually under
       * control of the Medley DSK file system or not.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);
    }
  } else {
    /*
     * Just unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }
}